

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncGeneratorNextFunction(JavascriptLibrary *this)

{
  JavascriptFunction *pJVar1;
  RuntimeFunction *pRVar2;
  
  pJVar1 = (this->asyncGeneratorNextFunction).ptr;
  if (pJVar1 != (JavascriptFunction *)0x0) {
    return pJVar1;
  }
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptAsyncGenerator::EntryInfo::Next,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x107);
  Memory::Recycler::WBSetBit((char *)&this->asyncGeneratorNextFunction);
  (this->asyncGeneratorNextFunction).ptr = &pRVar2->super_JavascriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->asyncGeneratorNextFunction);
  return (this->asyncGeneratorNextFunction).ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureAsyncGeneratorNextFunction()
    {
        if (asyncGeneratorNextFunction == nullptr)
        {
            asyncGeneratorNextFunction = DefaultCreateFunction(&JavascriptAsyncGenerator::EntryInfo::Next, 1, nullptr, nullptr, PropertyIds::next);
        }
        return asyncGeneratorNextFunction;
    }